

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O1

void __thiscall
llvm::
StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
::clear(StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
        *this)

{
  StringMapEntryBase **ppSVar1;
  StringMapEntryBase *__ptr;
  ulong uVar2;
  ulong uVar3;
  
  if ((this->super_StringMapImpl).NumItems != 0) {
    uVar3 = (ulong)(this->super_StringMapImpl).NumBuckets;
    if (uVar3 != 0) {
      uVar2 = 0;
      do {
        ppSVar1 = (this->super_StringMapImpl).TheTable;
        __ptr = ppSVar1[uVar2];
        if ((__ptr != (StringMapEntryBase *)0xfffffffffffffff8) &&
           (__ptr != (StringMapEntryBase *)0x0)) {
          if ((long *)__ptr[1].StrLen != (long *)0x0) {
            (**(code **)(*(long *)__ptr[1].StrLen + 8))();
          }
          __ptr[1].StrLen = 0;
          free(__ptr);
        }
        ppSVar1[uVar2] = (StringMapEntryBase *)0x0;
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
    }
    (this->super_StringMapImpl).NumItems = 0;
    (this->super_StringMapImpl).NumTombstones = 0;
  }
  return;
}

Assistant:

bool empty() const { return NumItems == 0; }